

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chset.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
set_class(compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          *this,char_class_type *m,bool no)

{
  undefined3 in_register_00000011;
  
  this->has_posix_ = true;
  if (CONCAT31(in_register_00000011,no) != 0) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(&this->posix_no_,m);
    return;
  }
  this->posix_yes_ = this->posix_yes_ | *m;
  return;
}

Assistant:

void set_class(char_class_type const &m, bool no)
    {
        this->has_posix_ = true;

        if(no)
        {
            this->posix_no_.push_back(m);
        }
        else
        {
            this->posix_yes_ |= m;
        }
    }